

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buflist.c
# Opt level: O1

int lws_buflist_append_segment(lws_buflist **head,uint8_t *buf,size_t len)

{
  lws_buflist *plVar1;
  int iVar2;
  lws_buflist *plVar3;
  char *format;
  
  plVar1 = *head;
  if (buf == (uint8_t *)0x0) {
    __assert_fail("buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core/buflist.c"
                  ,0x2a,
                  "int lws_buflist_append_segment(struct lws_buflist **, const uint8_t *, size_t)");
  }
  if (len == 0) {
    __assert_fail("len",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core/buflist.c"
                  ,0x2b,
                  "int lws_buflist_append_segment(struct lws_buflist **, const uint8_t *, size_t)");
  }
  iVar2 = -0x400;
  do {
    plVar3 = ((lws_buflist *)head)->next;
    if (plVar3 == (lws_buflist *)0x0) {
      _lws_log(8,"%s: len %u first %d %p\n","lws_buflist_append_segment",len & 0xffffffff,
               (ulong)(plVar1 == (lws_buflist *)0x0));
      plVar3 = (lws_buflist *)lws_realloc((void *)0x0,len + 0x29,"lws_buflist_append_segment");
      if (plVar3 != (lws_buflist *)0x0) {
        plVar3->len = len;
        plVar3->pos = 0;
        plVar3->next = (lws_buflist *)0x0;
        memcpy(&plVar3[1].pos,buf,len);
        ((lws_buflist *)head)->next = plVar3;
        return (uint)(plVar1 == (lws_buflist *)0x0);
      }
      format = "%s: OOM\n";
      goto LAB_0013809b;
    }
    iVar2 = iVar2 + 1;
    if (iVar2 == 0) {
      format = "%s: buflist reached sanity limit\n";
      goto LAB_0013809b;
    }
    head = &plVar3->next;
  } while (plVar3 != plVar3->next);
  format = "%s: corrupt list points to self\n";
LAB_0013809b:
  _lws_log(1,format,"lws_buflist_append_segment");
  return -1;
}

Assistant:

int
lws_buflist_append_segment(struct lws_buflist **head, const uint8_t *buf,
			   size_t len)
{
	struct lws_buflist *nbuf;
	int first = !*head;
	void *p = *head;
	int sanity = 1024;

	assert(buf);
	assert(len);

	/* append at the tail */
	while (*head) {
		if (!--sanity) {
			lwsl_err("%s: buflist reached sanity limit\n", __func__);
			return -1;
		}
		if (*head == (*head)->next) {
			lwsl_err("%s: corrupt list points to self\n", __func__);
			return -1;
		}
		head = &((*head)->next);
	}

	(void)p;
	lwsl_info("%s: len %u first %d %p\n", __func__, (unsigned int)len,
					      first, p);

	nbuf = (struct lws_buflist *)lws_malloc(sizeof(struct lws_buflist) +
						len + LWS_PRE + 1, __func__);
	if (!nbuf) {
		lwsl_err("%s: OOM\n", __func__);
		return -1;
	}

	nbuf->len = len;
	nbuf->pos = 0;
	nbuf->next = NULL;

	/* whoever consumes this might need LWS_PRE from the start... */
	p = (uint8_t *)nbuf + sizeof(*nbuf) + LWS_PRE;
	memcpy(p, buf, len);

	*head = nbuf;

	return first; /* returns 1 if first segment just created */
}